

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndTabBar(void)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiPtrOrIndex *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiTabBar *pIVar6;
  uint uVar7;
  float fVar8;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((pIVar3->SkipItems == false) && (pIVar6 = GImGui->CurrentTabBar, pIVar6 != (ImGuiTabBar *)0x0)
     ) {
    if (pIVar6->WantLayout == true) {
      TabBarLayout(pIVar6);
    }
    if (((pIVar6->VisibleTabWasSubmitted == false) && (pIVar6->VisibleTabId != 0)) &&
       (pIVar5->FrameCount <= pIVar6->PrevFrameVisible + 1)) {
      (pIVar3->DC).CursorPos.y = (pIVar6->BarRect).Max.y + pIVar6->PrevTabsContentsHeight;
    }
    else {
      fVar1 = (pIVar6->BarRect).Max.y;
      fVar8 = (pIVar3->DC).CursorPos.y - fVar1;
      uVar7 = -(uint)(pIVar6->CurrTabsContentsHeight <= fVar8);
      fVar8 = (float)(~uVar7 & (uint)pIVar6->CurrTabsContentsHeight | (uint)fVar8 & uVar7);
      pIVar6->CurrTabsContentsHeight = fVar8;
      (pIVar3->DC).CursorPos.y = fVar8 + fVar1;
    }
    if ('\x01' < pIVar6->BeginCount) {
      (pIVar3->DC).CursorPos = pIVar6->BackupCursorPos;
    }
    if ((pIVar6->Flags & 0x100000) == 0) {
      PopID();
    }
    iVar2 = (pIVar5->CurrentTabBarStack).Size;
    (pIVar5->CurrentTabBarStack).Size = iVar2 + -1;
    if (iVar2 + -1 == 0) {
      pIVar6 = (ImGuiTabBar *)0x0;
    }
    else {
      pIVar4 = (pIVar5->CurrentTabBarStack).Data;
      pIVar6 = (ImGuiTabBar *)pIVar4[(long)iVar2 + -2].Ptr;
      if (pIVar6 == (ImGuiTabBar *)0x0) {
        pIVar6 = (GImGui->TabBars).Buf.Data + pIVar4[(long)iVar2 + -2].Index;
      }
    }
    pIVar5->CurrentTabBar = pIVar6;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }

    // Fallback in case no TabItem have been submitted
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
    {
        tab_bar->CurrTabsContentsHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, tab_bar->CurrTabsContentsHeight);
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->CurrTabsContentsHeight;
    }
    else
    {
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->PrevTabsContentsHeight;
    }
    if (tab_bar->BeginCount > 1)
        window->DC.CursorPos = tab_bar->BackupCursorPos;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}